

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

size_t bitset_union_count(bitset_t *b1,bitset_t *b2)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  ushort uVar8;
  byte bVar32;
  undefined1 auVar14 [12];
  undefined1 auVar17 [12];
  char cVar33;
  byte bVar34;
  char cVar35;
  byte bVar36;
  char cVar37;
  byte bVar38;
  char cVar39;
  byte bVar40;
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar30 [16];
  char cVar41;
  undefined1 auVar46 [12];
  byte bVar74;
  char cVar75;
  byte bVar76;
  char cVar77;
  byte bVar78;
  char cVar79;
  byte bVar80;
  char cVar81;
  byte bVar82;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar48 [12];
  undefined1 auVar65 [16];
  undefined1 auVar49 [12];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar50 [12];
  undefined1 auVar70 [16];
  undefined1 auVar51 [12];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  ushort uVar42;
  undefined4 uVar43;
  undefined6 uVar44;
  undefined8 uVar45;
  undefined1 auVar47 [12];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar57 [14];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  
  uVar4 = b1->arraysize;
  uVar3 = b2->arraysize;
  uVar6 = uVar3;
  if (uVar4 < uVar3) {
    uVar6 = uVar4;
  }
  sVar1 = 0;
  for (uVar2 = 0; uVar2 + 3 < uVar6; uVar2 = uVar2 + 4) {
    auVar24 = *(undefined1 (*) [16])(b2->array + uVar2) | *(undefined1 (*) [16])(b1->array + uVar2);
    auVar58 = *(undefined1 (*) [16])(b2->array + uVar2 + 2) |
              *(undefined1 (*) [16])(b1->array + uVar2 + 2);
    auVar83._0_2_ = auVar58._0_2_ >> 1;
    auVar83._2_2_ = auVar58._2_2_ >> 1;
    auVar83._4_2_ = auVar58._4_2_ >> 1;
    auVar83._6_2_ = auVar58._6_2_ >> 1;
    auVar83._8_2_ = auVar58._8_2_ >> 1;
    auVar83._10_2_ = auVar58._10_2_ >> 1;
    auVar83._12_2_ = auVar58._12_2_ >> 1;
    auVar83._14_2_ = auVar58._14_2_ >> 1;
    auVar83 = auVar83 & _DAT_0012a580;
    uVar8 = CONCAT11(auVar58[1] - auVar83[1],auVar58[0] - auVar83[0]);
    uVar9 = CONCAT13(auVar58[3] - auVar83[3],CONCAT12(auVar58[2] - auVar83[2],uVar8));
    uVar10 = CONCAT15(auVar58[5] - auVar83[5],CONCAT14(auVar58[4] - auVar83[4],uVar9));
    uVar11 = CONCAT17(auVar58[7] - auVar83[7],CONCAT16(auVar58[6] - auVar83[6],uVar10));
    auVar46._0_10_ = CONCAT19(auVar58[9] - auVar83[9],CONCAT18(auVar58[8] - auVar83[8],uVar11));
    auVar46[10] = auVar58[10] - auVar83[10];
    auVar46[0xb] = auVar58[0xb] - auVar83[0xb];
    auVar52[0xc] = auVar58[0xc] - auVar83[0xc];
    auVar52._0_12_ = auVar46;
    auVar52[0xd] = auVar58[0xd] - auVar83[0xd];
    auVar62[0xe] = auVar58[0xe] - auVar83[0xe];
    auVar62._0_14_ = auVar52;
    auVar62[0xf] = auVar58[0xf] - auVar83[0xf];
    auVar58 = auVar62 & _DAT_0012a590;
    auVar59._0_2_ = uVar8 >> 2;
    auVar59._2_2_ = (ushort)((uint)uVar9 >> 0x12);
    auVar59._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
    auVar59._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
    auVar59._8_2_ = (ushort)((unkuint10)auVar46._0_10_ >> 0x42);
    auVar59._10_2_ = auVar46._10_2_ >> 2;
    auVar59._12_2_ = auVar52._12_2_ >> 2;
    auVar59._14_2_ = auVar62._14_2_ >> 2;
    auVar59 = auVar59 & _DAT_0012a590;
    cVar41 = auVar59[0] + auVar58[0];
    bVar74 = auVar59[1] + auVar58[1];
    uVar42 = CONCAT11(bVar74,cVar41);
    cVar75 = auVar59[2] + auVar58[2];
    bVar76 = auVar59[3] + auVar58[3];
    uVar43 = CONCAT13(bVar76,CONCAT12(cVar75,uVar42));
    cVar77 = auVar59[4] + auVar58[4];
    bVar78 = auVar59[5] + auVar58[5];
    uVar44 = CONCAT15(bVar78,CONCAT14(cVar77,uVar43));
    cVar79 = auVar59[6] + auVar58[6];
    bVar80 = auVar59[7] + auVar58[7];
    uVar45 = CONCAT17(bVar80,CONCAT16(cVar79,uVar44));
    cVar81 = auVar59[8] + auVar58[8];
    bVar82 = auVar59[9] + auVar58[9];
    auVar47._0_10_ = CONCAT19(bVar82,CONCAT18(cVar81,uVar45));
    auVar47[10] = auVar59[10] + auVar58[10];
    auVar47[0xb] = auVar59[0xb] + auVar58[0xb];
    auVar53[0xc] = auVar59[0xc] + auVar58[0xc];
    auVar53._0_12_ = auVar47;
    auVar53[0xd] = auVar59[0xd] + auVar58[0xd];
    auVar60[0xe] = auVar59[0xe] + auVar58[0xe];
    auVar60._0_14_ = auVar53;
    auVar60[0xf] = auVar59[0xf] + auVar58[0xf];
    auVar61._0_2_ = auVar24._0_2_ >> 1;
    auVar61._2_2_ = auVar24._2_2_ >> 1;
    auVar61._4_2_ = auVar24._4_2_ >> 1;
    auVar61._6_2_ = auVar24._6_2_ >> 1;
    auVar61._8_2_ = auVar24._8_2_ >> 1;
    auVar61._10_2_ = auVar24._10_2_ >> 1;
    auVar61._12_2_ = auVar24._12_2_ >> 1;
    auVar61._14_2_ = auVar24._14_2_ >> 1;
    auVar61 = auVar61 & _DAT_0012a580;
    uVar8 = CONCAT11(auVar24[1] - auVar61[1],auVar24[0] - auVar61[0]);
    uVar9 = CONCAT13(auVar24[3] - auVar61[3],CONCAT12(auVar24[2] - auVar61[2],uVar8));
    uVar10 = CONCAT15(auVar24[5] - auVar61[5],CONCAT14(auVar24[4] - auVar61[4],uVar9));
    uVar11 = CONCAT17(auVar24[7] - auVar61[7],CONCAT16(auVar24[6] - auVar61[6],uVar10));
    auVar12._0_10_ = CONCAT19(auVar24[9] - auVar61[9],CONCAT18(auVar24[8] - auVar61[8],uVar11));
    auVar12[10] = auVar24[10] - auVar61[10];
    auVar12[0xb] = auVar24[0xb] - auVar61[0xb];
    auVar18[0xc] = auVar24[0xc] - auVar61[0xc];
    auVar18._0_12_ = auVar12;
    auVar18[0xd] = auVar24[0xd] - auVar61[0xd];
    auVar58[0xe] = auVar24[0xe] - auVar61[0xe];
    auVar58._0_14_ = auVar18;
    auVar58[0xf] = auVar24[0xf] - auVar61[0xf];
    auVar62 = auVar58 & _DAT_0012a590;
    auVar24._0_2_ = uVar8 >> 2;
    auVar24._2_2_ = (ushort)((uint)uVar9 >> 0x12);
    auVar24._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
    auVar24._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
    auVar24._8_2_ = (ushort)((unkuint10)auVar12._0_10_ >> 0x42);
    auVar24._10_2_ = auVar12._10_2_ >> 2;
    auVar24._12_2_ = auVar18._12_2_ >> 2;
    auVar24._14_2_ = auVar58._14_2_ >> 2;
    auVar24 = auVar24 & _DAT_0012a590;
    cVar7 = auVar24[0] + auVar62[0];
    bVar32 = auVar24[1] + auVar62[1];
    uVar8 = CONCAT11(bVar32,cVar7);
    cVar33 = auVar24[2] + auVar62[2];
    bVar34 = auVar24[3] + auVar62[3];
    uVar9 = CONCAT13(bVar34,CONCAT12(cVar33,uVar8));
    cVar35 = auVar24[4] + auVar62[4];
    bVar36 = auVar24[5] + auVar62[5];
    uVar10 = CONCAT15(bVar36,CONCAT14(cVar35,uVar9));
    cVar37 = auVar24[6] + auVar62[6];
    bVar38 = auVar24[7] + auVar62[7];
    uVar11 = CONCAT17(bVar38,CONCAT16(cVar37,uVar10));
    cVar39 = auVar24[8] + auVar62[8];
    bVar40 = auVar24[9] + auVar62[9];
    auVar13._0_10_ = CONCAT19(bVar40,CONCAT18(cVar39,uVar11));
    auVar13[10] = auVar24[10] + auVar62[10];
    auVar13[0xb] = auVar24[0xb] + auVar62[0xb];
    auVar19[0xc] = auVar24[0xc] + auVar62[0xc];
    auVar19._0_12_ = auVar13;
    auVar19[0xd] = auVar24[0xd] + auVar62[0xd];
    auVar25[0xe] = auVar24[0xe] + auVar62[0xe];
    auVar25._0_14_ = auVar19;
    auVar25[0xf] = auVar24[0xf] + auVar62[0xf];
    auVar63[0] = ((char)(uVar8 >> 4) + cVar7 & 0xfU) + ((char)(uVar42 >> 4) + cVar41 & 0xfU);
    auVar63[1] = ((bVar32 >> 4) + bVar32 & 0xf) + ((bVar74 >> 4) + bVar74 & 0xf);
    auVar63[2] = ((char)(ushort)((uint)uVar9 >> 0x14) + cVar33 & 0xfU) +
                 ((char)(ushort)((uint)uVar43 >> 0x14) + cVar75 & 0xfU);
    auVar63[3] = ((bVar34 >> 4) + bVar34 & 0xf) + ((bVar76 >> 4) + bVar76 & 0xf);
    auVar63[4] = ((char)(ushort)((uint6)uVar10 >> 0x24) + cVar35 & 0xfU) +
                 ((char)(ushort)((uint6)uVar44 >> 0x24) + cVar77 & 0xfU);
    auVar63[5] = ((bVar36 >> 4) + bVar36 & 0xf) + ((bVar78 >> 4) + bVar78 & 0xf);
    auVar63[6] = ((char)(ushort)((ulong)uVar11 >> 0x34) + cVar37 & 0xfU) +
                 ((char)(ushort)((ulong)uVar45 >> 0x34) + cVar79 & 0xfU);
    auVar63[7] = ((bVar38 >> 4) + bVar38 & 0xf) + ((bVar80 >> 4) + bVar80 & 0xf);
    auVar63[8] = ((char)(ushort)((unkuint10)auVar13._0_10_ >> 0x44) + cVar39 & 0xfU) +
                 ((char)(ushort)((unkuint10)auVar47._0_10_ >> 0x44) + cVar81 & 0xfU);
    auVar63[9] = ((bVar40 >> 4) + bVar40 & 0xf) + ((bVar82 >> 4) + bVar82 & 0xf);
    auVar63[10] = ((char)(auVar13._10_2_ >> 4) + auVar13[10] & 0xfU) +
                  ((char)(auVar47._10_2_ >> 4) + auVar47[10] & 0xfU);
    auVar63[0xb] = ((auVar13[0xb] >> 4) + auVar13[0xb] & 0xf) +
                   ((auVar47[0xb] >> 4) + auVar47[0xb] & 0xf);
    auVar63[0xc] = ((char)(auVar19._12_2_ >> 4) + auVar19[0xc] & 0xfU) +
                   ((char)(auVar53._12_2_ >> 4) + auVar53[0xc] & 0xfU);
    auVar63[0xd] = ((auVar19[0xd] >> 4) + auVar19[0xd] & 0xf) +
                   ((auVar53[0xd] >> 4) + auVar53[0xd] & 0xf);
    auVar63[0xe] = ((char)(auVar25._14_2_ >> 4) + auVar25[0xe] & 0xfU) +
                   ((char)(auVar60._14_2_ >> 4) + auVar60[0xe] & 0xfU);
    auVar63[0xf] = ((auVar25[0xf] >> 4) + auVar25[0xf] & 0xf) +
                   ((auVar60[0xf] >> 4) + auVar60[0xf] & 0xf);
    auVar24 = psadbw(auVar63,(undefined1  [16])0x0);
    sVar1 = sVar1 + auVar24._8_8_ + auVar24._0_8_;
  }
  for (; uVar2 < uVar6; uVar2 = uVar2 + 1) {
    uVar5 = b2->array[uVar2] | b1->array[uVar2];
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    sVar1 = sVar1 + (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  if (uVar4 < uVar3) {
    for (; uVar2 + 3 < uVar3; uVar2 = uVar2 + 4) {
      auVar24 = *(undefined1 (*) [16])(b2->array + uVar2);
      auVar58 = *(undefined1 (*) [16])(b2->array + uVar2 + 2);
      auVar84._0_2_ = auVar58._0_2_ >> 1;
      auVar84._2_2_ = auVar58._2_2_ >> 1;
      auVar84._4_2_ = auVar58._4_2_ >> 1;
      auVar84._6_2_ = auVar58._6_2_ >> 1;
      auVar84._8_2_ = auVar58._8_2_ >> 1;
      auVar84._10_2_ = auVar58._10_2_ >> 1;
      auVar84._12_2_ = auVar58._12_2_ >> 1;
      auVar84._14_2_ = auVar58._14_2_ >> 1;
      auVar84 = auVar84 & _DAT_0012a580;
      uVar8 = CONCAT11(auVar58[1] - auVar84[1],auVar58[0] - auVar84[0]);
      uVar9 = CONCAT13(auVar58[3] - auVar84[3],CONCAT12(auVar58[2] - auVar84[2],uVar8));
      uVar10 = CONCAT15(auVar58[5] - auVar84[5],CONCAT14(auVar58[4] - auVar84[4],uVar9));
      uVar11 = CONCAT17(auVar58[7] - auVar84[7],CONCAT16(auVar58[6] - auVar84[6],uVar10));
      auVar48._0_10_ = CONCAT19(auVar58[9] - auVar84[9],CONCAT18(auVar58[8] - auVar84[8],uVar11));
      auVar48[10] = auVar58[10] - auVar84[10];
      auVar48[0xb] = auVar58[0xb] - auVar84[0xb];
      auVar54[0xc] = auVar58[0xc] - auVar84[0xc];
      auVar54._0_12_ = auVar48;
      auVar54[0xd] = auVar58[0xd] - auVar84[0xd];
      auVar64[0xe] = auVar58[0xe] - auVar84[0xe];
      auVar64._0_14_ = auVar54;
      auVar64[0xf] = auVar58[0xf] - auVar84[0xf];
      auVar58 = auVar64 & _DAT_0012a590;
      auVar65._0_2_ = uVar8 >> 2;
      auVar65._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar65._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar65._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar65._8_2_ = (ushort)((unkuint10)auVar48._0_10_ >> 0x42);
      auVar65._10_2_ = auVar48._10_2_ >> 2;
      auVar65._12_2_ = auVar54._12_2_ >> 2;
      auVar65._14_2_ = auVar64._14_2_ >> 2;
      auVar65 = auVar65 & _DAT_0012a590;
      cVar41 = auVar65[0] + auVar58[0];
      bVar74 = auVar65[1] + auVar58[1];
      uVar42 = CONCAT11(bVar74,cVar41);
      cVar75 = auVar65[2] + auVar58[2];
      bVar76 = auVar65[3] + auVar58[3];
      uVar43 = CONCAT13(bVar76,CONCAT12(cVar75,uVar42));
      cVar77 = auVar65[4] + auVar58[4];
      bVar78 = auVar65[5] + auVar58[5];
      uVar44 = CONCAT15(bVar78,CONCAT14(cVar77,uVar43));
      cVar79 = auVar65[6] + auVar58[6];
      bVar80 = auVar65[7] + auVar58[7];
      uVar45 = CONCAT17(bVar80,CONCAT16(cVar79,uVar44));
      cVar81 = auVar65[8] + auVar58[8];
      bVar82 = auVar65[9] + auVar58[9];
      auVar49._0_10_ = CONCAT19(bVar82,CONCAT18(cVar81,uVar45));
      auVar49[10] = auVar65[10] + auVar58[10];
      auVar49[0xb] = auVar65[0xb] + auVar58[0xb];
      auVar55[0xc] = auVar65[0xc] + auVar58[0xc];
      auVar55._0_12_ = auVar49;
      auVar55[0xd] = auVar65[0xd] + auVar58[0xd];
      auVar66[0xe] = auVar65[0xe] + auVar58[0xe];
      auVar66._0_14_ = auVar55;
      auVar66[0xf] = auVar65[0xf] + auVar58[0xf];
      auVar67._0_2_ = auVar24._0_2_ >> 1;
      auVar67._2_2_ = auVar24._2_2_ >> 1;
      auVar67._4_2_ = auVar24._4_2_ >> 1;
      auVar67._6_2_ = auVar24._6_2_ >> 1;
      auVar67._8_2_ = auVar24._8_2_ >> 1;
      auVar67._10_2_ = auVar24._10_2_ >> 1;
      auVar67._12_2_ = auVar24._12_2_ >> 1;
      auVar67._14_2_ = auVar24._14_2_ >> 1;
      auVar67 = auVar67 & _DAT_0012a580;
      uVar8 = CONCAT11(auVar24[1] - auVar67[1],auVar24[0] - auVar67[0]);
      uVar9 = CONCAT13(auVar24[3] - auVar67[3],CONCAT12(auVar24[2] - auVar67[2],uVar8));
      uVar10 = CONCAT15(auVar24[5] - auVar67[5],CONCAT14(auVar24[4] - auVar67[4],uVar9));
      uVar11 = CONCAT17(auVar24[7] - auVar67[7],CONCAT16(auVar24[6] - auVar67[6],uVar10));
      auVar14._0_10_ = CONCAT19(auVar24[9] - auVar67[9],CONCAT18(auVar24[8] - auVar67[8],uVar11));
      auVar14[10] = auVar24[10] - auVar67[10];
      auVar14[0xb] = auVar24[0xb] - auVar67[0xb];
      auVar20[0xc] = auVar24[0xc] - auVar67[0xc];
      auVar20._0_12_ = auVar14;
      auVar20[0xd] = auVar24[0xd] - auVar67[0xd];
      auVar26[0xe] = auVar24[0xe] - auVar67[0xe];
      auVar26._0_14_ = auVar20;
      auVar26[0xf] = auVar24[0xf] - auVar67[0xf];
      auVar24 = auVar26 & _DAT_0012a590;
      auVar27._0_2_ = uVar8 >> 2;
      auVar27._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar27._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar27._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar27._8_2_ = (ushort)((unkuint10)auVar14._0_10_ >> 0x42);
      auVar27._10_2_ = auVar14._10_2_ >> 2;
      auVar27._12_2_ = auVar20._12_2_ >> 2;
      auVar27._14_2_ = auVar26._14_2_ >> 2;
      auVar27 = auVar27 & _DAT_0012a590;
      cVar7 = auVar27[0] + auVar24[0];
      bVar32 = auVar27[1] + auVar24[1];
      uVar8 = CONCAT11(bVar32,cVar7);
      cVar33 = auVar27[2] + auVar24[2];
      bVar34 = auVar27[3] + auVar24[3];
      uVar9 = CONCAT13(bVar34,CONCAT12(cVar33,uVar8));
      cVar35 = auVar27[4] + auVar24[4];
      bVar36 = auVar27[5] + auVar24[5];
      uVar10 = CONCAT15(bVar36,CONCAT14(cVar35,uVar9));
      cVar37 = auVar27[6] + auVar24[6];
      bVar38 = auVar27[7] + auVar24[7];
      uVar11 = CONCAT17(bVar38,CONCAT16(cVar37,uVar10));
      cVar39 = auVar27[8] + auVar24[8];
      bVar40 = auVar27[9] + auVar24[9];
      auVar15._0_10_ = CONCAT19(bVar40,CONCAT18(cVar39,uVar11));
      auVar15[10] = auVar27[10] + auVar24[10];
      auVar15[0xb] = auVar27[0xb] + auVar24[0xb];
      auVar21[0xc] = auVar27[0xc] + auVar24[0xc];
      auVar21._0_12_ = auVar15;
      auVar21[0xd] = auVar27[0xd] + auVar24[0xd];
      auVar28[0xe] = auVar27[0xe] + auVar24[0xe];
      auVar28._0_14_ = auVar21;
      auVar28[0xf] = auVar27[0xf] + auVar24[0xf];
      auVar68[0] = ((char)(uVar8 >> 4) + cVar7 & 0xfU) + ((char)(uVar42 >> 4) + cVar41 & 0xfU);
      auVar68[1] = ((bVar32 >> 4) + bVar32 & 0xf) + ((bVar74 >> 4) + bVar74 & 0xf);
      auVar68[2] = ((char)(ushort)((uint)uVar9 >> 0x14) + cVar33 & 0xfU) +
                   ((char)(ushort)((uint)uVar43 >> 0x14) + cVar75 & 0xfU);
      auVar68[3] = ((bVar34 >> 4) + bVar34 & 0xf) + ((bVar76 >> 4) + bVar76 & 0xf);
      auVar68[4] = ((char)(ushort)((uint6)uVar10 >> 0x24) + cVar35 & 0xfU) +
                   ((char)(ushort)((uint6)uVar44 >> 0x24) + cVar77 & 0xfU);
      auVar68[5] = ((bVar36 >> 4) + bVar36 & 0xf) + ((bVar78 >> 4) + bVar78 & 0xf);
      auVar68[6] = ((char)(ushort)((ulong)uVar11 >> 0x34) + cVar37 & 0xfU) +
                   ((char)(ushort)((ulong)uVar45 >> 0x34) + cVar79 & 0xfU);
      auVar68[7] = ((bVar38 >> 4) + bVar38 & 0xf) + ((bVar80 >> 4) + bVar80 & 0xf);
      auVar68[8] = ((char)(ushort)((unkuint10)auVar15._0_10_ >> 0x44) + cVar39 & 0xfU) +
                   ((char)(ushort)((unkuint10)auVar49._0_10_ >> 0x44) + cVar81 & 0xfU);
      auVar68[9] = ((bVar40 >> 4) + bVar40 & 0xf) + ((bVar82 >> 4) + bVar82 & 0xf);
      auVar68[10] = ((char)(auVar15._10_2_ >> 4) + auVar15[10] & 0xfU) +
                    ((char)(auVar49._10_2_ >> 4) + auVar49[10] & 0xfU);
      auVar68[0xb] = ((auVar15[0xb] >> 4) + auVar15[0xb] & 0xf) +
                     ((auVar49[0xb] >> 4) + auVar49[0xb] & 0xf);
      auVar68[0xc] = ((char)(auVar21._12_2_ >> 4) + auVar21[0xc] & 0xfU) +
                     ((char)(auVar55._12_2_ >> 4) + auVar55[0xc] & 0xfU);
      auVar68[0xd] = ((auVar21[0xd] >> 4) + auVar21[0xd] & 0xf) +
                     ((auVar55[0xd] >> 4) + auVar55[0xd] & 0xf);
      auVar68[0xe] = ((char)(auVar28._14_2_ >> 4) + auVar28[0xe] & 0xfU) +
                     ((char)(auVar66._14_2_ >> 4) + auVar66[0xe] & 0xfU);
      auVar68[0xf] = ((auVar28[0xf] >> 4) + auVar28[0xf] & 0xf) +
                     ((auVar66[0xf] >> 4) + auVar66[0xf] & 0xf);
      auVar24 = psadbw(auVar68,(undefined1  [16])0x0);
      sVar1 = sVar1 + auVar24._8_8_ + auVar24._0_8_;
    }
    for (; uVar2 < uVar3; uVar2 = uVar2 + 1) {
      uVar4 = b2->array[uVar2] - (b2->array[uVar2] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      sVar1 = sVar1 + (((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    }
  }
  else {
    for (; uVar2 + 3 < uVar4; uVar2 = uVar2 + 4) {
      auVar24 = *(undefined1 (*) [16])(b1->array + uVar2);
      auVar58 = *(undefined1 (*) [16])(b1->array + uVar2 + 2);
      auVar85._0_2_ = auVar58._0_2_ >> 1;
      auVar85._2_2_ = auVar58._2_2_ >> 1;
      auVar85._4_2_ = auVar58._4_2_ >> 1;
      auVar85._6_2_ = auVar58._6_2_ >> 1;
      auVar85._8_2_ = auVar58._8_2_ >> 1;
      auVar85._10_2_ = auVar58._10_2_ >> 1;
      auVar85._12_2_ = auVar58._12_2_ >> 1;
      auVar85._14_2_ = auVar58._14_2_ >> 1;
      auVar85 = auVar85 & _DAT_0012a580;
      uVar8 = CONCAT11(auVar58[1] - auVar85[1],auVar58[0] - auVar85[0]);
      uVar9 = CONCAT13(auVar58[3] - auVar85[3],CONCAT12(auVar58[2] - auVar85[2],uVar8));
      uVar10 = CONCAT15(auVar58[5] - auVar85[5],CONCAT14(auVar58[4] - auVar85[4],uVar9));
      uVar11 = CONCAT17(auVar58[7] - auVar85[7],CONCAT16(auVar58[6] - auVar85[6],uVar10));
      auVar50._0_10_ = CONCAT19(auVar58[9] - auVar85[9],CONCAT18(auVar58[8] - auVar85[8],uVar11));
      auVar50[10] = auVar58[10] - auVar85[10];
      auVar50[0xb] = auVar58[0xb] - auVar85[0xb];
      auVar56[0xc] = auVar58[0xc] - auVar85[0xc];
      auVar56._0_12_ = auVar50;
      auVar56[0xd] = auVar58[0xd] - auVar85[0xd];
      auVar69[0xe] = auVar58[0xe] - auVar85[0xe];
      auVar69._0_14_ = auVar56;
      auVar69[0xf] = auVar58[0xf] - auVar85[0xf];
      auVar58 = auVar69 & _DAT_0012a590;
      auVar70._0_2_ = uVar8 >> 2;
      auVar70._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar70._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar70._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar70._8_2_ = (ushort)((unkuint10)auVar50._0_10_ >> 0x42);
      auVar70._10_2_ = auVar50._10_2_ >> 2;
      auVar70._12_2_ = auVar56._12_2_ >> 2;
      auVar70._14_2_ = auVar69._14_2_ >> 2;
      auVar70 = auVar70 & _DAT_0012a590;
      cVar41 = auVar70[0] + auVar58[0];
      bVar74 = auVar70[1] + auVar58[1];
      uVar42 = CONCAT11(bVar74,cVar41);
      cVar75 = auVar70[2] + auVar58[2];
      bVar76 = auVar70[3] + auVar58[3];
      uVar43 = CONCAT13(bVar76,CONCAT12(cVar75,uVar42));
      cVar77 = auVar70[4] + auVar58[4];
      bVar78 = auVar70[5] + auVar58[5];
      uVar44 = CONCAT15(bVar78,CONCAT14(cVar77,uVar43));
      cVar79 = auVar70[6] + auVar58[6];
      bVar80 = auVar70[7] + auVar58[7];
      uVar45 = CONCAT17(bVar80,CONCAT16(cVar79,uVar44));
      cVar81 = auVar70[8] + auVar58[8];
      bVar82 = auVar70[9] + auVar58[9];
      auVar51._0_10_ = CONCAT19(bVar82,CONCAT18(cVar81,uVar45));
      auVar51[10] = auVar70[10] + auVar58[10];
      auVar51[0xb] = auVar70[0xb] + auVar58[0xb];
      auVar57[0xc] = auVar70[0xc] + auVar58[0xc];
      auVar57._0_12_ = auVar51;
      auVar57[0xd] = auVar70[0xd] + auVar58[0xd];
      auVar71[0xe] = auVar70[0xe] + auVar58[0xe];
      auVar71._0_14_ = auVar57;
      auVar71[0xf] = auVar70[0xf] + auVar58[0xf];
      auVar72._0_2_ = auVar24._0_2_ >> 1;
      auVar72._2_2_ = auVar24._2_2_ >> 1;
      auVar72._4_2_ = auVar24._4_2_ >> 1;
      auVar72._6_2_ = auVar24._6_2_ >> 1;
      auVar72._8_2_ = auVar24._8_2_ >> 1;
      auVar72._10_2_ = auVar24._10_2_ >> 1;
      auVar72._12_2_ = auVar24._12_2_ >> 1;
      auVar72._14_2_ = auVar24._14_2_ >> 1;
      auVar72 = auVar72 & _DAT_0012a580;
      uVar8 = CONCAT11(auVar24[1] - auVar72[1],auVar24[0] - auVar72[0]);
      uVar9 = CONCAT13(auVar24[3] - auVar72[3],CONCAT12(auVar24[2] - auVar72[2],uVar8));
      uVar10 = CONCAT15(auVar24[5] - auVar72[5],CONCAT14(auVar24[4] - auVar72[4],uVar9));
      uVar11 = CONCAT17(auVar24[7] - auVar72[7],CONCAT16(auVar24[6] - auVar72[6],uVar10));
      auVar16._0_10_ = CONCAT19(auVar24[9] - auVar72[9],CONCAT18(auVar24[8] - auVar72[8],uVar11));
      auVar16[10] = auVar24[10] - auVar72[10];
      auVar16[0xb] = auVar24[0xb] - auVar72[0xb];
      auVar22[0xc] = auVar24[0xc] - auVar72[0xc];
      auVar22._0_12_ = auVar16;
      auVar22[0xd] = auVar24[0xd] - auVar72[0xd];
      auVar29[0xe] = auVar24[0xe] - auVar72[0xe];
      auVar29._0_14_ = auVar22;
      auVar29[0xf] = auVar24[0xf] - auVar72[0xf];
      auVar24 = auVar29 & _DAT_0012a590;
      auVar30._0_2_ = uVar8 >> 2;
      auVar30._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar30._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar30._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar30._8_2_ = (ushort)((unkuint10)auVar16._0_10_ >> 0x42);
      auVar30._10_2_ = auVar16._10_2_ >> 2;
      auVar30._12_2_ = auVar22._12_2_ >> 2;
      auVar30._14_2_ = auVar29._14_2_ >> 2;
      auVar30 = auVar30 & _DAT_0012a590;
      cVar7 = auVar30[0] + auVar24[0];
      bVar32 = auVar30[1] + auVar24[1];
      uVar8 = CONCAT11(bVar32,cVar7);
      cVar33 = auVar30[2] + auVar24[2];
      bVar34 = auVar30[3] + auVar24[3];
      uVar9 = CONCAT13(bVar34,CONCAT12(cVar33,uVar8));
      cVar35 = auVar30[4] + auVar24[4];
      bVar36 = auVar30[5] + auVar24[5];
      uVar10 = CONCAT15(bVar36,CONCAT14(cVar35,uVar9));
      cVar37 = auVar30[6] + auVar24[6];
      bVar38 = auVar30[7] + auVar24[7];
      uVar11 = CONCAT17(bVar38,CONCAT16(cVar37,uVar10));
      cVar39 = auVar30[8] + auVar24[8];
      bVar40 = auVar30[9] + auVar24[9];
      auVar17._0_10_ = CONCAT19(bVar40,CONCAT18(cVar39,uVar11));
      auVar17[10] = auVar30[10] + auVar24[10];
      auVar17[0xb] = auVar30[0xb] + auVar24[0xb];
      auVar23[0xc] = auVar30[0xc] + auVar24[0xc];
      auVar23._0_12_ = auVar17;
      auVar23[0xd] = auVar30[0xd] + auVar24[0xd];
      auVar31[0xe] = auVar30[0xe] + auVar24[0xe];
      auVar31._0_14_ = auVar23;
      auVar31[0xf] = auVar30[0xf] + auVar24[0xf];
      auVar73[0] = ((char)(uVar8 >> 4) + cVar7 & 0xfU) + ((char)(uVar42 >> 4) + cVar41 & 0xfU);
      auVar73[1] = ((bVar32 >> 4) + bVar32 & 0xf) + ((bVar74 >> 4) + bVar74 & 0xf);
      auVar73[2] = ((char)(ushort)((uint)uVar9 >> 0x14) + cVar33 & 0xfU) +
                   ((char)(ushort)((uint)uVar43 >> 0x14) + cVar75 & 0xfU);
      auVar73[3] = ((bVar34 >> 4) + bVar34 & 0xf) + ((bVar76 >> 4) + bVar76 & 0xf);
      auVar73[4] = ((char)(ushort)((uint6)uVar10 >> 0x24) + cVar35 & 0xfU) +
                   ((char)(ushort)((uint6)uVar44 >> 0x24) + cVar77 & 0xfU);
      auVar73[5] = ((bVar36 >> 4) + bVar36 & 0xf) + ((bVar78 >> 4) + bVar78 & 0xf);
      auVar73[6] = ((char)(ushort)((ulong)uVar11 >> 0x34) + cVar37 & 0xfU) +
                   ((char)(ushort)((ulong)uVar45 >> 0x34) + cVar79 & 0xfU);
      auVar73[7] = ((bVar38 >> 4) + bVar38 & 0xf) + ((bVar80 >> 4) + bVar80 & 0xf);
      auVar73[8] = ((char)(ushort)((unkuint10)auVar17._0_10_ >> 0x44) + cVar39 & 0xfU) +
                   ((char)(ushort)((unkuint10)auVar51._0_10_ >> 0x44) + cVar81 & 0xfU);
      auVar73[9] = ((bVar40 >> 4) + bVar40 & 0xf) + ((bVar82 >> 4) + bVar82 & 0xf);
      auVar73[10] = ((char)(auVar17._10_2_ >> 4) + auVar17[10] & 0xfU) +
                    ((char)(auVar51._10_2_ >> 4) + auVar51[10] & 0xfU);
      auVar73[0xb] = ((auVar17[0xb] >> 4) + auVar17[0xb] & 0xf) +
                     ((auVar51[0xb] >> 4) + auVar51[0xb] & 0xf);
      auVar73[0xc] = ((char)(auVar23._12_2_ >> 4) + auVar23[0xc] & 0xfU) +
                     ((char)(auVar57._12_2_ >> 4) + auVar57[0xc] & 0xfU);
      auVar73[0xd] = ((auVar23[0xd] >> 4) + auVar23[0xd] & 0xf) +
                     ((auVar57[0xd] >> 4) + auVar57[0xd] & 0xf);
      auVar73[0xe] = ((char)(auVar31._14_2_ >> 4) + auVar31[0xe] & 0xfU) +
                     ((char)(auVar71._14_2_ >> 4) + auVar71[0xe] & 0xfU);
      auVar73[0xf] = ((auVar31[0xf] >> 4) + auVar31[0xf] & 0xf) +
                     ((auVar71[0xf] >> 4) + auVar71[0xf] & 0xf);
      auVar24 = psadbw(auVar73,(undefined1  [16])0x0);
      sVar1 = sVar1 + auVar24._8_8_ + auVar24._0_8_;
    }
    for (; uVar2 < uVar4; uVar2 = uVar2 + 1) {
      uVar3 = b1->array[uVar2] - (b1->array[uVar2] >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      sVar1 = sVar1 + (((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    }
  }
  return sVar1;
}

Assistant:

size_t bitset_union_count(const bitset_t *CROARING_CBITSET_RESTRICT b1,
                          const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t answer = 0;
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k + 3 < minlength; k += 4) {
        answer += roaring_hamming(b1->array[k] | b2->array[k]);
        answer += roaring_hamming(b1->array[k + 1] | b2->array[k + 1]);
        answer += roaring_hamming(b1->array[k + 2] | b2->array[k + 2]);
        answer += roaring_hamming(b1->array[k + 3] | b2->array[k + 3]);
    }
    for (; k < minlength; ++k) {
        answer += roaring_hamming(b1->array[k] | b2->array[k]);
    }
    if (b2->arraysize > b1->arraysize) {
        // k is equal to b1->arraysize
        for (; k + 3 < b2->arraysize; k += 4) {
            answer += roaring_hamming(b2->array[k]);
            answer += roaring_hamming(b2->array[k + 1]);
            answer += roaring_hamming(b2->array[k + 2]);
            answer += roaring_hamming(b2->array[k + 3]);
        }
        for (; k < b2->arraysize; ++k) {
            answer += roaring_hamming(b2->array[k]);
        }
    } else {
        // k is equal to b2->arraysize
        for (; k + 3 < b1->arraysize; k += 4) {
            answer += roaring_hamming(b1->array[k]);
            answer += roaring_hamming(b1->array[k + 1]);
            answer += roaring_hamming(b1->array[k + 2]);
            answer += roaring_hamming(b1->array[k + 3]);
        }
        for (; k < b1->arraysize; ++k) {
            answer += roaring_hamming(b1->array[k]);
        }
    }
    return answer;
}